

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Combo(char *label,int *current_item,char *items_separated_by_zeros,int height_in_items)

{
  bool bVar1;
  size_t sVar2;
  char *in_RDX;
  bool value_changed;
  char *p;
  int items_count;
  int in_stack_00000078;
  int in_stack_0000007c;
  void *in_stack_00000080;
  _func_char_ptr_void_ptr_int *in_stack_00000088;
  int *in_stack_00000090;
  char *in_stack_00000098;
  char *local_28;
  
  for (local_28 = in_RDX; *local_28 != '\0'; local_28 = local_28 + sVar2 + 1) {
    sVar2 = strlen(local_28);
  }
  bVar1 = Combo(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                in_stack_0000007c,in_stack_00000078);
  return bVar1;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* items_separated_by_zeros, int height_in_items)
{
    int items_count = 0;
    const char* p = items_separated_by_zeros;       // FIXME-OPT: Avoid computing this, or at least only when combo is open
    while (*p)
    {
        p += strlen(p) + 1;
        items_count++;
    }
    bool value_changed = Combo(label, current_item, Items_SingleStringGetter, (void*)items_separated_by_zeros, items_count, height_in_items);
    return value_changed;
}